

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O3

bool __thiscall libcalc::Token::push(Token *this,char symbol)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  
  bVar2 = symbolType(symbol);
  if (bVar2 == 3) {
LAB_0010281a:
    bVar3 = false;
  }
  else {
    cVar1 = this->type;
    if (cVar1 == '\x02' && (bVar2 ^ 2) == 0) {
LAB_00102831:
      std::__cxx11::string::push_back((char)this);
    }
    else {
      if (cVar1 != '\0') {
        if ((bVar2 ^ 2) == 0 && cVar1 == '\x01') {
          iVar4 = std::__cxx11::string::compare((char *)this);
          if (iVar4 == 0) {
            this->type = '\x02';
            goto LAB_00102831;
          }
        }
        goto LAB_0010281a;
      }
      this->type = bVar2;
      std::__cxx11::string::_M_replace_aux((ulong)this,0,(this->value)._M_string_length,'\x01');
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Token::push(const char symbol) {
  char st = symbolType(symbol);

  if (st == TOKEN_TYPE.GARBAGE) {
    return false;
  }

  if (type == TOKEN_TYPE.SYMBOL && st == type) {
    value += symbol;
    return true;
  }

  if (type == TOKEN_TYPE.EMPTY) {
    type = st;
    value = symbol;
    return true;
  }

  if (type == TOKEN_TYPE.OPERATOR &&
      st == TOKEN_TYPE.SYMBOL     &&
      value == "-" ) {
    type = st;
    value += symbol;
    return true;
  }

  return false;
}